

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
CppGenerator::addProductToLoop
          (CppGenerator *this,ProductAggregate *prodAgg,size_t *currentLoop,bool *loopsOverRelation,
          size_t *maxDepth)

{
  ulong uVar1;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *this_00;
  _WordT *p_Var2;
  vector<AggRegTuple,std::allocator<AggRegTuple>> *pvVar3;
  long lVar4;
  long lVar5;
  pair<unsigned_long,_unsigned_long> **pppVar6;
  ulong *puVar7;
  size_t sVar8;
  pointer pdVar9;
  pointer pbVar10;
  pointer pvVar11;
  iterator __position;
  pointer pmVar12;
  pointer pvVar13;
  pointer pvVar14;
  pointer pvVar15;
  unsigned_long uVar16;
  pointer pvVar17;
  pointer pAVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  pair<unsigned_long,_unsigned_long> pVar25;
  pair<unsigned_long,_unsigned_long> pVar26;
  pair<unsigned_long,_unsigned_long> pVar27;
  _WordT _Var28;
  _WordT _Var29;
  bool bVar30;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *y;
  size_t sVar31;
  long lVar32;
  iterator iVar33;
  mapped_type *pmVar34;
  size_type sVar35;
  size_type sVar36;
  iterator iVar37;
  mapped_type *pmVar38;
  ulong uVar39;
  iterator iVar40;
  mapped_type *pmVar41;
  pointer ppVar42;
  pointer puVar43;
  pair<unsigned_long,_unsigned_long> *__args;
  mapped_type mVar44;
  mapped_type mVar45;
  unsigned_long *puVar46;
  iterator iVar47;
  undefined8 uVar48;
  ulong uVar49;
  byte bVar50;
  pair<unsigned_long,_unsigned_long> pVar51;
  pair<unsigned_long,_unsigned_long> pVar52;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  viewReg;
  dyn_bitset viewsForThisLoop;
  size_t nextLoop;
  prod_bitset loopFunctions;
  bool local_240;
  bool local_23c;
  _Base_ptr local_238;
  mapped_type local_230;
  size_type local_200;
  undefined1 local_1e8 [16];
  pair<unsigned_long,_unsigned_long> *local_1d8;
  size_type local_1d0;
  bool local_1c8;
  unsigned_long local_1c0;
  undefined2 uStack_1b8;
  undefined6 uStack_1b6;
  undefined2 local_1b0;
  undefined6 uStack_1ae;
  bool local_1a8;
  bool bStack_1a7;
  size_t local_1a0;
  undefined2 local_198;
  unsigned_long local_190;
  _Base_ptr p_Stack_188;
  bool local_180;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  undefined8 local_108;
  mapped_type local_100;
  unsigned_long local_f8;
  key_type local_f0;
  
  bVar50 = 0;
  sVar8 = *currentLoop;
  y = (this->listOfLoops).
      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + sVar8;
  pdVar9 = (this->viewsPerLoop).
           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_128.m_bits,&pdVar9[sVar8].m_bits);
  local_128.m_num_bits = pdVar9[sVar8].m_num_bits;
  sVar31 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  *loopsOverRelation =
       (local_128.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar31 >> 6] >> (sVar31 & 0x3f) & 1) != 0;
  sVar31 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  bVar19 = (byte)sVar31 & 0x3f;
  local_128.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar31 >> 6] =
       local_128.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[sVar31 >> 6] &
       (-2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19);
  sVar31 = *currentLoop;
  pbVar10 = (this->functionsPerLoop).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  memcpy(&local_f0,prodAgg,0xc0);
  lVar32 = 0;
  do {
    p_Var2 = pbVar10[sVar31].super__Base_bitset<24UL>._M_w + lVar32;
    uVar20 = *(uint *)((long)p_Var2 + 4);
    _Var28 = p_Var2[1];
    uVar21 = *(uint *)((long)p_Var2 + 0xc);
    uVar22 = *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar32 * 8 + 4);
    _Var29 = local_f0.super__Base_bitset<24UL>._M_w[lVar32 + 1];
    uVar23 = *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar32 * 8 + 0xc);
    *(uint *)(local_f0.super__Base_bitset<24UL>._M_w + lVar32) =
         (uint)local_f0.super__Base_bitset<24UL>._M_w[lVar32] & (uint)*p_Var2;
    *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar32 * 8 + 4) = uVar22 & uVar20;
    *(uint *)(local_f0.super__Base_bitset<24UL>._M_w + lVar32 + 1) = (uint)_Var29 & (uint)_Var28;
    *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar32 * 8 + 0xc) = uVar23 & uVar21;
    lVar32 = lVar32 + 2;
  } while (lVar32 != 0x18);
  if (local_f0.super__Base_bitset<24UL>._M_w[0] == 0) {
    uVar49 = 0xffffffffffffffff;
    do {
      if (uVar49 == 0x16) goto LAB_00240d62;
      uVar39 = uVar49 + 1;
      lVar32 = uVar49 + 2;
      uVar49 = uVar39;
    } while (local_f0.super__Base_bitset<24UL>._M_w[lVar32] == 0);
    if (uVar39 < 0x17) goto LAB_00240d14;
LAB_00240d62:
    uVar48 = 0;
    mVar44 = 0;
  }
  else {
LAB_00240d14:
    iVar33 = std::
             _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->localProductMap).
                     super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar31]._M_h,&local_f0);
    if (iVar33.super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
        ._M_cur == (__node_type *)0x0) {
      sVar31 = *currentLoop;
      pvVar11 = (this->localProductList).
                super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar32 = (long)*(pointer *)
                      ((long)&pvVar11[sVar31].
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar11[sVar31].
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data;
      pmVar34 = std::__detail::
                _Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)((this->localProductMap).
                                 super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + sVar31),&local_f0);
      sVar31 = lVar32 >> 6;
      mVar44 = sVar31 * -0x5555555555555555;
      *pmVar34 = mVar44;
      this_00 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                ((this->localProductList).
                 super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *currentLoop);
      __position._M_current = *(bitset<1500UL> **)(this_00 + 8);
      if (__position._M_current == *(bitset<1500UL> **)(this_00 + 0x10)) {
        uVar48 = CONCAT71((int7)(lVar32 >> 0xe),1);
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>const&>(this_00,__position,&local_f0);
        goto LAB_00240df5;
      }
      memcpy(__position._M_current,&local_f0,0xc0);
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xc0;
    }
    else {
      mVar44 = *(mapped_type *)
                ((long)iVar33.
                       super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                       ._M_cur + 200);
    }
    uVar48 = CONCAT71((int7)(sVar31 >> 8),1);
  }
LAB_00240df5:
  local_200 = 0x7fffffff;
  local_108 = uVar48;
  local_100 = mVar44;
  if ((prodAgg->viewAggregate).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (prodAgg->viewAggregate).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_238 = (_Base_ptr)0x7fffffff;
    local_240 = false;
LAB_0024102d:
    local_23c = false;
  }
  else {
    sVar35 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(&local_128)
    ;
    if (1 < sVar35) {
      local_1e8._0_8_ = (pointer)0x0;
      local_1e8._8_8_ = (pair<unsigned_long,_unsigned_long> *)0x0;
      local_1d8 = (pair<unsigned_long,_unsigned_long> *)0x0;
      sVar36 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                         (&local_128,0);
      for (; sVar36 != 0xffffffffffffffff;
          sVar36 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                             ((this->viewsPerLoop).
                              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + *currentLoop,sVar36)) {
        for (__args = (prodAgg->viewAggregate).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            __args != (prodAgg->viewAggregate).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
          if (__args->first == sVar36) {
            if ((pair<unsigned_long,_unsigned_long> *)local_1e8._8_8_ == local_1d8) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)local_1e8,(iterator)local_1e8._8_8_,__args);
            }
            else {
              uVar16 = __args->second;
              *(unsigned_long *)local_1e8._8_8_ = __args->first;
              *(unsigned_long *)(local_1e8._8_8_ + 8) = uVar16;
              local_1e8._8_8_ = local_1e8._8_8_ + 0x10;
            }
            break;
          }
        }
      }
      iVar37 = std::
               _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
               ::find(&(this->viewProductMap).
                       super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[*currentLoop]._M_t,
                      (key_type *)local_1e8);
      local_200 = *currentLoop;
      pmVar12 = (this->viewProductMap).
                super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (iVar37._M_node == &pmVar12[local_200]._M_t._M_impl.super__Rb_tree_header._M_header) {
        pvVar13 = (this->viewProductList).
                  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar32 = *(long *)&pvVar13[local_200].
                           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        pvVar14 = *(pointer *)
                   ((long)&pvVar13[local_200].
                           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data + 8);
        pmVar38 = std::
                  map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                  ::operator[](pmVar12 + local_200,(key_type *)local_1e8);
        local_238 = (_Base_ptr)(((long)pvVar14 - lVar32 >> 3) * -0x5555555555555555);
        *pmVar38 = (mapped_type)local_238;
        local_200 = *currentLoop;
        std::
        vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
        ::push_back((this->viewProductList).
                    super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_200,(value_type *)local_1e8);
      }
      else {
        local_238 = iVar37._M_node[1]._M_right;
      }
      if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_240 = true;
      goto LAB_0024102d;
    }
    sVar35 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(&local_128)
    ;
    if (sVar35 == 1) {
      sVar36 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                         (&local_128,0);
      local_23c = true;
      for (ppVar42 = (prodAgg->viewAggregate).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar42 !=
          (prodAgg->viewAggregate).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar42 = ppVar42 + 1) {
        if (ppVar42->first == sVar36) {
          local_238 = (_Base_ptr)ppVar42->second;
          local_240 = false;
          local_200 = sVar36;
          goto LAB_00241037;
        }
      }
      local_240 = false;
      local_238 = (_Base_ptr)0x7fffffff;
    }
    else {
      local_23c = false;
      local_238 = (_Base_ptr)0x7fffffff;
      local_240 = false;
    }
  }
LAB_00241037:
  pVar27.second = local_1e8._8_8_;
  pVar27.first = local_1e8._0_8_;
  pvVar15 = (this->nextLoopsPerLoop).
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1e8._0_8_ =
       (long)(this->listOfLoops).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->listOfLoops).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  puVar43 = pvVar15[sVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar15[sVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data + 8) == puVar43) {
    pVar51.second = 0;
    pVar51.first = local_1e8._0_8_;
  }
  else {
    uVar49 = 0;
    pVar25.second = 0;
    pVar25.first = local_1e8._0_8_;
    local_1e8 = (undefined1  [16])pVar27;
    do {
      uVar16 = puVar43[uVar49];
      local_f8 = uVar16;
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,
                       (this->listOfLoops).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16,y);
      bVar30 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_1e8,y);
      if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1e8._0_8_);
      }
      if (!bVar30) {
        std::operator<<((ostream *)&std::cerr,"There is a problem with nextLoopsPerLoop\n");
        exit(1);
      }
      memcpy(local_1e8,
             (this->functionsPerLoopBranch).
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
             super__Vector_impl_data._M_start + uVar16,0xc0);
      lVar32 = 0;
      pVar26 = (pair<unsigned_long,_unsigned_long>)local_1e8;
      do {
        p_Var2 = (prodAgg->product).super__Base_bitset<24UL>._M_w + lVar32;
        uVar20 = *(uint *)((long)p_Var2 + 4);
        _Var28 = p_Var2[1];
        uVar21 = *(uint *)((long)p_Var2 + 0xc);
        lVar4 = lVar32 * 8;
        uVar22 = *(uint *)(local_1e8 + lVar4 + 4);
        uVar23 = *(uint *)(local_1e8 + lVar4 + 8);
        uVar24 = *(uint *)(local_1e8 + lVar4 + 0xc);
        lVar5 = lVar32 * 8;
        local_1e8 = (undefined1  [16])pVar26;
        *(uint *)(local_1e8 + lVar5) = *(uint *)(local_1e8 + lVar4) & (uint)*p_Var2;
        *(uint *)(local_1e8 + lVar5 + 4) = uVar22 & uVar20;
        *(uint *)(local_1e8 + lVar5 + 8) = uVar23 & (uint)_Var28;
        pVar26.second = local_1e8._8_8_;
        pVar26.first = local_1e8._0_8_;
        *(uint *)(local_1e8 + lVar5 + 0xc) = uVar24 & uVar21;
        lVar32 = lVar32 + 2;
      } while (lVar32 != 0x18);
      if ((pointer)local_1e8._0_8_ == (pointer)0x0) {
        uVar39 = 0xffffffffffffffff;
        do {
          pVar51 = pVar25;
          if (uVar39 == 0x16) goto LAB_0024135a;
          uVar1 = uVar39 + 1;
          pppVar6 = &local_1d8 + uVar39;
          uVar39 = uVar1;
        } while (*pppVar6 == (pair<unsigned_long,_unsigned_long> *)0x0);
        local_1e8 = (undefined1  [16])pVar26;
        if (uVar1 < 0x17) goto LAB_0024111f;
      }
      else {
LAB_0024111f:
        pVar51 = addProductToLoop(this,prodAgg,&local_f8,loopsOverRelation,maxDepth);
        pvVar15 = (this->nextLoopsPerLoop).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar32 = *(long *)&pvVar15[sVar8].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data;
        if (uVar49 + 1 !=
            (long)*(pointer *)
                   ((long)&pvVar15[sVar8].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar32 >> 3) {
          memcpy(local_1e8,
                 (this->functionsPerLoopBranch).
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + *(long *)(lVar32 + 8 + uVar49 * 8),0xc0)
          ;
          lVar32 = 0;
          do {
            p_Var2 = (prodAgg->product).super__Base_bitset<24UL>._M_w + lVar32;
            uVar20 = *(uint *)((long)p_Var2 + 4);
            _Var28 = p_Var2[1];
            uVar21 = *(uint *)((long)p_Var2 + 0xc);
            lVar4 = lVar32 * 8;
            uVar22 = *(uint *)(local_1e8 + lVar4 + 4);
            uVar23 = *(uint *)(local_1e8 + lVar4 + 8);
            uVar24 = *(uint *)(local_1e8 + lVar4 + 0xc);
            lVar5 = lVar32 * 8;
            *(uint *)(local_1e8 + lVar5) = *(uint *)(local_1e8 + lVar4) & (uint)*p_Var2;
            *(uint *)(local_1e8 + lVar5 + 4) = uVar22 & uVar20;
            *(uint *)(local_1e8 + lVar5 + 8) = uVar23 & (uint)_Var28;
            *(uint *)(local_1e8 + lVar5 + 0xc) = uVar24 & uVar21;
            lVar32 = lVar32 + 2;
          } while (lVar32 != 0x18);
          if ((pointer)local_1e8._0_8_ == (pointer)0x0) {
            uVar39 = 0xffffffffffffffff;
            do {
              if (uVar39 == 0x16) goto LAB_0024135a;
              uVar1 = uVar39 + 1;
              pppVar6 = &local_1d8 + uVar39;
              uVar39 = uVar1;
            } while (*pppVar6 == (pair<unsigned_long,_unsigned_long> *)0x0);
            if (0x16 < uVar1) goto LAB_0024135a;
          }
          local_1d0 = 0;
          local_1c8 = false;
          local_1d8 = (pair<unsigned_long,_unsigned_long> *)((ulong)local_1d8 & 0xffffffffffffff00);
          bStack_1a7 = false;
          local_1c0 = 0;
          local_1a0 = 100;
          local_198._0_1_ = false;
          local_198._1_1_ = false;
          local_180 = false;
          local_190 = 0;
          p_Stack_188 = (_Base_ptr)0x0;
          local_1a8 = true;
          uStack_1b8 = (undefined2)pVar51.first;
          uStack_1b6 = pVar51.first._2_6_;
          local_1b0 = (undefined2)pVar51.second;
          uStack_1ae = pVar51.second._2_6_;
          local_1e8 = (undefined1  [16])pVar25;
          iVar40 = std::
                   _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->aggregateRegisterMap).
                           super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_h,
                          (key_type *)local_1e8);
          if (iVar40.super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>.
              _M_cur == (__node_type *)0x0) {
            pvVar17 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar18 = *(pointer *)
                       ((long)&pvVar17[uVar16].
                               super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl
                               .super__Vector_impl_data + 8);
            lVar32 = *(long *)&pvVar17[uVar16].
                               super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl
                               .super__Vector_impl_data;
            pmVar41 = std::__detail::
                      _Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)((this->aggregateRegisterMap).
                                       super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar16),
                                   (key_type *)local_1e8);
            local_230 = ((long)pAVar18 - lVar32 >> 4) * 0x6db6db6db6db6db7;
            *pmVar41 = local_230;
            pvVar3 = (vector<AggRegTuple,std::allocator<AggRegTuple>> *)
                     ((this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar16);
            iVar47._M_current = *(AggRegTuple **)(pvVar3 + 8);
            if (iVar47._M_current == *(AggRegTuple **)(pvVar3 + 0x10)) {
              std::vector<AggRegTuple,std::allocator<AggRegTuple>>::
              _M_realloc_insert<AggRegTuple_const&>(pvVar3,iVar47,(AggRegTuple *)local_1e8);
            }
            else {
              puVar46 = (unsigned_long *)local_1e8;
              for (lVar32 = 0xe; lVar32 != 0; lVar32 = lVar32 + -1) {
                ((iVar47._M_current)->previous).first = *puVar46;
                puVar46 = puVar46 + (ulong)bVar50 * -2 + 1;
                iVar47._M_current = iVar47._M_current + (ulong)bVar50 * -0x10 + 8;
              }
              *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 0x70;
            }
          }
          else {
            local_230 = *(mapped_type *)
                         ((long)iVar40.
                                super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>
                                ._M_cur + 0x78);
          }
          pVar51.second = local_230;
          pVar51.first = uVar16;
        }
      }
LAB_0024135a:
      uVar49 = uVar49 + 1;
      pvVar15 = (this->nextLoopsPerLoop).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar43 = pvVar15[sVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVar25 = pVar51;
    } while (uVar49 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar15[sVar8].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + 8) - (long)puVar43
                             >> 3));
    local_1e8._0_8_ =
         (long)(this->listOfLoops).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->listOfLoops).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  local_1c8 = false;
  local_1c0 = 0;
  local_1a8 = false;
  bStack_1a7 = false;
  local_1a0 = 100;
  local_1d8 = (pair<unsigned_long,_unsigned_long> *)CONCAT71(local_1d8._1_7_,(char)local_108);
  local_1d0 = local_100;
  local_190 = local_200;
  p_Stack_188 = local_238;
  local_198._1_1_ = local_23c;
  local_198._0_1_ = local_240;
  uStack_1b8 = (undefined2)pVar51.first;
  uStack_1b6 = pVar51.first._2_6_;
  local_1b0 = (undefined2)pVar51.second;
  uStack_1ae = pVar51.second._2_6_;
  local_1e8._8_8_ = (pointer)0x0;
  local_180 = false;
  puVar43 = (y->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar32 = (long)(y->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar43;
  if (lVar32 != 0) {
    uVar49 = lVar32 >> 3;
    if (*puVar43 != 0) goto LAB_002414e0;
    uVar39 = 0;
    do {
      if ((uVar49 + (uVar49 == 0)) - 1 == uVar39) goto LAB_00241489;
      uVar1 = uVar39 + 1;
      lVar32 = uVar39 + 1;
      uVar39 = uVar1;
    } while (puVar43[lVar32] == 0);
    if (uVar1 < uVar49) goto LAB_002414e0;
  }
LAB_00241489:
  uVar49 = (prodAgg->previous).first;
  if (uVar49 < *maxDepth) {
    puVar7 = (ulong *)(*(long *)&(this->productToVariableRegister).
                                 super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar49].
                                 super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                                 ._M_impl.super__Vector_impl_data + 0xe8 +
                      (prodAgg->previous).second * 0x100);
    local_1e8._0_8_ = *puVar7;
    local_1e8._8_8_ = puVar7[1];
    local_1a0 = uVar49;
  }
  if ((*loopsOverRelation == false) && (prodAgg->multiplyByCount == true)) {
    local_180 = true;
  }
LAB_002414e0:
  iVar40 = std::
           _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->aggregateRegisterMap).
                   super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar8]._M_h,(key_type *)local_1e8);
  if (iVar40.super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>._M_cur ==
      (__node_type *)0x0) {
    pvVar17 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar18 = *(pointer *)
               ((long)&pvVar17[sVar8].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                       _M_impl.super__Vector_impl_data + 8);
    lVar32 = *(long *)&pvVar17[sVar8].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                       _M_impl.super__Vector_impl_data;
    pmVar41 = std::__detail::
              _Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)((this->aggregateRegisterMap).
                               super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sVar8),
                           (key_type *)local_1e8);
    mVar45 = ((long)pAVar18 - lVar32 >> 4) * 0x6db6db6db6db6db7;
    *pmVar41 = mVar45;
    pvVar3 = (vector<AggRegTuple,std::allocator<AggRegTuple>> *)
             ((this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + sVar8);
    iVar47._M_current = *(AggRegTuple **)(pvVar3 + 8);
    if (iVar47._M_current == *(AggRegTuple **)(pvVar3 + 0x10)) {
      std::vector<AggRegTuple,std::allocator<AggRegTuple>>::_M_realloc_insert<AggRegTuple_const&>
                (pvVar3,iVar47,(AggRegTuple *)local_1e8);
    }
    else {
      puVar46 = (unsigned_long *)local_1e8;
      for (lVar32 = 0xe; lVar32 != 0; lVar32 = lVar32 + -1) {
        ((iVar47._M_current)->previous).first = *puVar46;
        puVar46 = puVar46 + (ulong)bVar50 * -2 + 1;
        iVar47._M_current = iVar47._M_current + (ulong)bVar50 * -0x10 + 8;
      }
      *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 0x70;
    }
  }
  else {
    mVar45 = *(mapped_type *)
              ((long)iVar40.
                     super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>.
                     _M_cur + 0x78);
  }
  if (local_128.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pVar52.second = mVar45;
  pVar52.first = sVar8;
  return pVar52;
}

Assistant:

std::pair<size_t,size_t> CppGenerator::addProductToLoop(
    ProductAggregate& prodAgg, size_t& currentLoop, bool& loopsOverRelation,
    const size_t& maxDepth)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[currentLoop];

    dyn_bitset viewsForThisLoop = viewsPerLoop[currentLoop];
    loopsOverRelation = viewsForThisLoop[_qc->numberOfViews()];
    
    viewsForThisLoop.reset(_qc->numberOfViews());
 
    std::pair<bool,size_t> regTupleProduct = {false,0};  

    // check if this product requires computation over this loop loopmask
    prod_bitset loopFunctions = prodAgg.product & functionsPerLoop[currentLoop];
    if (loopFunctions.any())
    {
        // This should be add to the loop not depth 
        auto proditerator = localProductMap[currentLoop].find(loopFunctions);
        if (proditerator != localProductMap[currentLoop].end())
        {
            // set this local product to the id given by the map
            regTupleProduct = {true, proditerator->second};
        }
        else
        {
            size_t nextID = localProductList[currentLoop].size();
            localProductMap[currentLoop][loopFunctions] = nextID;
            regTupleProduct = {true, nextID};
            localProductList[currentLoop].push_back(loopFunctions);
        }
    }

    bool newViewProduct = false;
    bool singleViewAgg = false;
    
    std::pair<size_t, size_t> regTupleView = {2147483647,2147483647};

    if (!prodAgg.viewAggregate.empty())
    {
        if (viewsForThisLoop.count() > 1)
        {
            newViewProduct = true;
       
            std::vector<std::pair<size_t, size_t>> viewReg;

            size_t viewID = viewsForThisLoop.find_first();
            while (viewID != boost::dynamic_bitset<>::npos)
            {
                for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
                {
                    if (viewAgg.first == viewID)
                    {
                        viewReg.push_back(viewAgg);
                        break;
                    }
                }

                viewID = viewsPerLoop[currentLoop].find_next(viewID);
            }
            auto viewit = viewProductMap[currentLoop].find(viewReg);
            if (viewit != viewProductMap[currentLoop].end())
            {
                // set this local product to the id given by the map
                regTupleView = {currentLoop, viewit->second};            
            }
            else
            {
                size_t nextID =  viewProductList[currentLoop].size();
                viewProductMap[currentLoop][viewReg] = nextID;
                regTupleView = {currentLoop, nextID};
                viewProductList[currentLoop].push_back(viewReg);
            }
        }
        else if (viewsForThisLoop.count() == 1)
        {
            // Inside a loop there would only be a single view agg, so we could avoid
            // explicitly materializing the view Agg and simply multiply directly with
            // the aggregate from the view - this could be captured in the aggregate
            // computation that captures both the local aggregate and the view Agg
            singleViewAgg = true;
        
            // reuse the simple aggregate from the corresponding view
            size_t viewID = viewsForThisLoop.find_first();

            for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
            {
                if (viewAgg.first == viewID)
                {
                    regTupleView = viewAgg;
                    break;
                }
            }

            /*************** PRINT OUT **************/
            // if (regTupleView.first == 2)
            // {
            //     std::cout << "################## " <<
            //         regTupleView.first << "  " << regTupleView.second << std::endl;
            // }
            /*************** PRINT OUT **************/

        }
    }
    
    
    std::pair<size_t,size_t> previousComputation = {listOfLoops.size(),0};
    
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) != thisLoop))
        {
            ERROR("There is a problem with nextLoopsPerLoop\n");
            exit(1);
        }
        
        if ((functionsPerLoopBranch[nextLoop] & prodAgg.product).any())
        {
            std::pair<size_t, size_t> postComputation =
                addProductToLoop(prodAgg, nextLoop, loopsOverRelation, maxDepth);
            
            if (next + 1 != nextLoopsPerLoop[thisLoopID].size() &&
                (functionsPerLoopBranch[nextLoopsPerLoop[thisLoopID][next+1]]&
                 prodAgg.product).any())
            {
                // Add this product to this loop with the 'prev'Computation
                AggRegTuple postRegTuple;
                postRegTuple.postLoopAgg = true;
                postRegTuple.previous = previousComputation; 
                postRegTuple.postLoop = postComputation;
                
                // TODO: add the aggregate to the register!!
                auto regit = aggregateRegisterMap[nextLoop].find(postRegTuple);
                if (regit != aggregateRegisterMap[nextLoop].end())
                {
                    previousComputation = {nextLoop,regit->second};
                }
                else
                {
                    // If so, add it to the aggregate register
                    size_t newID = newAggregateRegister[nextLoop].size();
                    aggregateRegisterMap[nextLoop][postRegTuple] = newID;
                    newAggregateRegister[nextLoop].push_back(postRegTuple);
                    
                    previousComputation =  {nextLoop,newID};
                }
            }
            else
            {
                previousComputation = postComputation;
            }
            
        }
    }
    
    // while(currentLoop < listOfLoops.size()-1)
    // {
    //     currentLoop++;
    //     if (((listOfLoops[currentLoop] & thisLoop) == thisLoop))
    //     {
    //         if ((functionsPerLoopBranch[currentLoop] & prodAgg.product).any())
    //         {
    //             std::pair<size_t, size_t> postComputation =
    //                 addProductToLoop(prodAgg,currentLoop,loopsOverRelation,maxDepth);
    //             /**************** PRINT OUT ******************/
    //             // std::cout << "HERE \n";
    //             // std::cout << listOfLoops[currentLoop] <<"  "<<thisLoop<<std::endl;
    //             /**************** PRINT OUT ******************/
    //             // Add this product to this loop with the 'prev'Computation
    //             AggRegTuple postRegTuple;
    //             postRegTuple.postLoopAgg = true;
    //             postRegTuple.localAgg = previousComputation; // TODO:TODO:TODO:
    //             postRegTuple.postLoop = postComputation;
    //             // TODO: add the aggregate to the register!!
    //             auto regit = aggregateRegisterMap[currentLoop].find(postRegTuple);
    //             if (regit != aggregateRegisterMap[currentLoop].end())
    //                 previousComputation = {currentLoop,regit->second};
    //             else
    //             {
    //                 // If so, add it to the aggregate register
    //                 size_t newID = newAggregateRegister[currentLoop].size();
    //                 aggregateRegisterMap[currentLoop][postRegTuple] = newID;
    //                 newAggregateRegister[currentLoop].push_back(postRegTuple); 
    //                 previousComputation =  {currentLoop,newID};;
    //             }
    //         }
    //     }
    //     else break;
    // }

    // Check if this product has already been computed, if not we add it to the list
    AggRegTuple regTuple;
    regTuple.product = regTupleProduct;
    regTuple.viewAgg = regTupleView;

    /********* PRINT OUT ********/
    // if (regTupleView.first == 2)
    // {
    //     std::cout << "###########/>>>>>>>>> " <<
    //         regTuple.viewAgg.first << "  " << regTuple.viewAgg.second << std::endl;
    // }
    /********* PRINT OUT ********/
           
    regTuple.newViewProduct = newViewProduct;
    regTuple.singleViewAgg = singleViewAgg;
    regTuple.postLoop = previousComputation;

    regTuple.previous = {listOfLoops.size(),0};
    regTuple.multiplyByCount = false;
    
    // Multiply by previous #computation -- if needed
    if (thisLoop.none())
    {
        if (prodAgg.previous.first < maxDepth)
        {            
            const ProductAggregate& prevProdAgg =
                productToVariableRegister[prodAgg.previous.first]
                [prodAgg.previous.second];
            regTuple.previous = prevProdAgg.correspondingLoopAgg;
            regTuple.prevDepth = prodAgg.previous.first;
        }
        // Mutliply by count if needed
        if (!loopsOverRelation && prodAgg.multiplyByCount)
            regTuple.multiplyByCount = true;
    }

    auto regit = aggregateRegisterMap[thisLoopID].find(regTuple);
    if (regit != aggregateRegisterMap[thisLoopID].end())
    {
        previousComputation = {thisLoopID,regit->second};
    }
    else
    {
        // If so, add it to the aggregate register
        size_t newID = newAggregateRegister[thisLoopID].size();
        aggregateRegisterMap[thisLoopID][regTuple] = newID;
        newAggregateRegister[thisLoopID].push_back(regTuple);
        
        previousComputation =  {thisLoopID,newID};
    }

    return previousComputation;
}